

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_zipx_ppmd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd8 *p;
  byte bVar1;
  byte bVar2;
  zip *zip;
  int iVar3;
  wchar_t wVar4;
  Bool BVar5;
  byte *pbVar6;
  uchar *puVar7;
  uint maxOrder;
  char *fmt;
  size_t sVar8;
  uint size_00;
  bool bVar9;
  ssize_t bytes_avail;
  ssize_t local_38;
  
  zip = (zip *)a->format->data;
  local_38 = 0;
  if (zip->decompress_init == '\0') {
    if (zip->ppmd8_valid != '\0') {
      Ppmd8_Free(&zip->ppmd8);
      zip->ppmd8_valid = '\0';
    }
    p = &zip->ppmd8;
    Ppmd8_Construct(p);
    zip->ppmd8_stream_failed = '\0';
    (zip->ppmd8).Stream.In = &zip->zipx_ppmd_stream;
    (zip->zipx_ppmd_stream).a = a;
    (zip->zipx_ppmd_stream).Read = ppmd_read;
    zip->zipx_ppmd_read_compressed = 0;
    pbVar6 = (byte *)__archive_read_ahead(a,2,(ssize_t *)0x0);
    if (pbVar6 != (byte *)0x0) {
      __archive_read_consume(a,2);
      bVar1 = *pbVar6;
      bVar2 = pbVar6[1];
      maxOrder = (bVar1 & 0xf) + 1;
      if (0x2f < bVar2 || (bVar1 & 0xf) == 0) {
        archive_set_error(&a->archive,0x54,
                          "Invalid parameter set in PPMd8 stream (order=%d, restore=%d)",
                          (ulong)maxOrder,(ulong)(bVar2 >> 4));
        return L'\xffffffe7';
      }
      size_00 = (((uint)bVar1 << 0x10 | (uint)bVar2 << 0x18) & 0xff00000) + 0x100000;
      BVar5 = Ppmd8_Alloc(p,size_00);
      if (BVar5 == 0) {
        archive_set_error(&a->archive,0xc,"Unable to allocate memory for PPMd8 stream: %d bytes",
                          (ulong)size_00);
        return L'\xffffffe2';
      }
      zip->ppmd8_valid = '\x01';
      BVar5 = Ppmd8_RangeDec_Init(p);
      if (BVar5 == 0) {
        fmt = "PPMd8 stream range decoder initialization error";
        iVar3 = 0x16;
        goto LAB_005c827e;
      }
      Ppmd8_Init(p,maxOrder,(uint)(bVar2 >> 4));
      free(zip->uncompressed_buffer);
      zip->uncompressed_buffer_size = 0x40000;
      puVar7 = (uchar *)malloc(0x40000);
      zip->uncompressed_buffer = puVar7;
      if (puVar7 == (uchar *)0x0) {
        fmt = "No memory for PPMd8 decompression";
        iVar3 = 0xc;
        goto LAB_005c827e;
      }
      zip->decompress_init = '\x01';
      zip->entry_compressed_bytes_read =
           zip->entry_compressed_bytes_read + zip->zipx_ppmd_read_compressed + 2;
      goto LAB_005c8107;
    }
    fmt = "Truncated file data in PPMd8 stream";
  }
  else {
LAB_005c8107:
    __archive_read_ahead(a,1,&local_38);
    if (-1 < local_38) {
      zip->zipx_ppmd_read_compressed = 0;
      sVar8 = 0;
      do {
        iVar3 = Ppmd8_DecodeSymbol(&zip->ppmd8);
        if (iVar3 < 0) {
          zip->end_of_entry = '\x01';
          bVar9 = false;
          goto LAB_005c8296;
        }
        if (zip->ppmd8_stream_failed != '\0') goto LAB_005c8183;
        zip->uncompressed_buffer[sVar8] = (uchar)iVar3;
        sVar8 = sVar8 + 1;
      } while (sVar8 < zip->uncompressed_buffer_size);
      bVar9 = zip->end_of_entry == '\0';
LAB_005c8296:
      *buff = zip->uncompressed_buffer;
      *size = sVar8;
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - zip->zipx_ppmd_read_compressed;
      zip->entry_compressed_bytes_read =
           zip->entry_compressed_bytes_read + zip->zipx_ppmd_read_compressed;
      zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + sVar8;
      if (!bVar9) {
        Ppmd8_Free(&zip->ppmd8);
        zip->ppmd8_valid = '\0';
      }
      wVar4 = consume_optional_marker(a,zip);
      return wVar4;
    }
LAB_005c8183:
    fmt = "Truncated PPMd8 file body";
  }
  iVar3 = 0x54;
LAB_005c827e:
  archive_set_error(&a->archive,iVar3,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_ppmd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	size_t consumed_bytes = 0;
	ssize_t bytes_avail = 0;

	(void) offset; /* UNUSED */

	/* If we're here for the first time, initialize Ppmd8 decompression
	 * context first. */
	if(!zip->decompress_init) {
		ret = zipx_ppmd8_init(a, zip);
		if(ret != ARCHIVE_OK)
			return ret;
	}

	/* Fetch for more data. We're reading 1 byte here, but libarchive
	 * should prefetch more bytes. */
	(void) __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated PPMd8 file body");
		return (ARCHIVE_FATAL);
	}

	/* This counter will be updated inside ppmd_read(), which at one
	 * point will be called by Ppmd8_DecodeSymbol. */
	zip->zipx_ppmd_read_compressed = 0;

	/* Decompression loop. */
	do {
		int sym = __archive_ppmd8_functions.Ppmd8_DecodeSymbol(
		    &zip->ppmd8);
		if(sym < 0) {
			zip->end_of_entry = 1;
			break;
		}

		/* This field is set by ppmd_read() when there was no more data
		 * to be read. */
		if(zip->ppmd8_stream_failed) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated PPMd8 file body");
			return (ARCHIVE_FATAL);
		}

		zip->uncompressed_buffer[consumed_bytes] = (uint8_t) sym;
		++consumed_bytes;
	} while(consumed_bytes < zip->uncompressed_buffer_size);

	/* Update pointers for libarchive. */
	*buff = zip->uncompressed_buffer;
	*size = consumed_bytes;

	/* Update pointers so we can continue decompression in another call. */
	zip->entry_bytes_remaining -= zip->zipx_ppmd_read_compressed;
	zip->entry_compressed_bytes_read += zip->zipx_ppmd_read_compressed;
	zip->entry_uncompressed_bytes_read += consumed_bytes;

	/* If we're at the end of stream, deinitialize Ppmd8 context. */
	if(zip->end_of_entry) {
		__archive_ppmd8_functions.Ppmd8_Free(&zip->ppmd8);
		zip->ppmd8_valid = 0;
	}

	/* Seek for optional marker, same way as in each zip entry. */
	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return ret;

	return ARCHIVE_OK;
}